

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

void helicsInputAddTarget(HelicsInput ipt,char *target,HelicsError *err)

{
  string_view target_00;
  InputObject *this;
  HelicsError *in_RDX;
  long in_RSI;
  InputObject *inpObj;
  Input *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  
  this = anon_unknown.dwarf_5d1c2::verifyInput
                   (in_stack_ffffffffffffffd8,(HelicsError *)in_stack_ffffffffffffffd0);
  if (this != (InputObject *)0x0) {
    if (in_RSI == 0) {
      assignError(in_RDX,-4,"The supplied string argument is null and therefore invalid");
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)this,in_stack_ffffffffffffffd8)
      ;
      target_00._M_str = (char *)this;
      target_00._M_len = (size_t)in_stack_ffffffffffffffd8;
      helics::Input::addTarget(in_stack_ffffffffffffffd0,target_00);
    }
  }
  return;
}

Assistant:

void helicsInputAddTarget(HelicsInput ipt, const char* target, HelicsError* err)
{
    auto* inpObj = verifyInput(ipt, err);
    if (inpObj == nullptr) {
        return;
    }
    CHECK_NULL_STRING(target, void());
    inpObj->inputPtr->addTarget(target);
}